

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O3

int __thiscall
duckdb_re2::NFA::Step(NFA *this,Threadq *runq,Threadq *nextq,int c,StringPiece *context,char *p)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Thread *pTVar5;
  Inst *pIVar6;
  char **__dest;
  char *pcVar7;
  Inst *pIVar8;
  char *pcVar9;
  ostream *poVar10;
  IndexValue *pIVar11;
  IndexValue *pIVar12;
  uint uVar13;
  uint uVar14;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  nextq->size_ = 0;
  if (runq->size_ != 0) {
    pIVar11 = (runq->dense_).ptr_._M_t.
              super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
              .
              super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
              ._M_head_impl;
    pcVar9 = p + -1;
    pIVar12 = pIVar11;
    do {
      pTVar5 = pIVar12->value_;
      if (pTVar5 != (Thread *)0x0) {
        bVar1 = this->longest_;
        if (((bVar1 != true) || (this->matched_ != true)) || (*pTVar5->capture <= *this->match_)) {
          iVar2 = pIVar12->index_;
          pIVar6 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
                   ((long)&(this->prog_->inst_).ptr_._M_t.
                           super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                   + 8))->_M_head_impl;
          uVar3 = pIVar6[iVar2].out_opcode_;
          uVar13 = uVar3 & 7;
          if (uVar13 == 1) {
            if (pIVar12 == pIVar11) {
              uVar13 = pIVar6[uVar3 >> 4].out_opcode_ & 7;
              if (uVar13 == 6) {
                uVar13 = pIVar6[pIVar6[uVar3 >> 4].out_opcode_ >> 4].out_opcode_ & 7;
              }
              if ((uVar13 == 2) || (bVar1 != false)) {
                memmove(this->match_,pTVar5->capture,(long)this->ncapture_ << 3);
                this->matched_ = true;
                iVar4 = (pTVar5->field_0).ref;
                (pTVar5->field_0).ref = iVar4 + -1;
                if (iVar4 < 2) {
                  pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
                  this->freelist_ = pTVar5;
                }
                while (pIVar11 = pIVar12 + 1,
                      pIVar11 !=
                      (runq->dense_).ptr_._M_t.
                      super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                      .
                      super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
                      ._M_head_impl + runq->size_) {
                  pTVar5 = pIVar12[1].value_;
                  pIVar12 = pIVar11;
                  if ((pTVar5 != (Thread *)0x0) &&
                     (iVar4 = (pTVar5->field_0).ref, (pTVar5->field_0).ref = iVar4 + -1, iVar4 < 2))
                  {
                    pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
                    this->freelist_ = pTVar5;
                  }
                }
                runq->size_ = 0;
                uVar13 = pIVar6[iVar2].out_opcode_ >> 4;
                pIVar8 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
                         ((long)&(this->prog_->inst_).ptr_._M_t.
                                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                         + 8))->_M_head_impl;
                uVar3 = pIVar8[uVar13].out_opcode_;
                uVar14 = uVar3 & 7;
                if (uVar14 != 2) {
                  if (uVar14 != 6) {
                    return uVar13;
                  }
                  if ((pIVar8[uVar3 >> 4].out_opcode_ & 7) != 2) {
                    return uVar13;
                  }
                }
                return pIVar6[iVar2].field_1.cap_;
              }
            }
          }
          else if (uVar13 == 2) {
            AddToThreadq(this,nextq,uVar3 >> 4,c,context,p,pTVar5);
          }
          else if (uVar13 == 5) {
            if (p == (char *)0x0) {
              memmove(this->match_,pTVar5->capture,(long)this->ncapture_ << 3);
              this->match_[1] = (char *)0x0;
LAB_011d24f2:
              this->matched_ = true;
            }
            else if ((this->endmatch_ != true) || (pcVar9 == this->etext_)) {
              if (bVar1 == false) {
                memmove(this->match_,pTVar5->capture,(long)this->ncapture_ << 3);
                this->match_[1] = pcVar9;
                this->matched_ = true;
                iVar2 = (pTVar5->field_0).ref;
                (pTVar5->field_0).ref = iVar2 + -1;
                if (iVar2 < 2) {
                  pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
                  this->freelist_ = pTVar5;
                }
                while (pIVar11 = pIVar12 + 1,
                      pIVar11 !=
                      (runq->dense_).ptr_._M_t.
                      super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                      .
                      super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
                      ._M_head_impl + runq->size_) {
                  pTVar5 = pIVar12[1].value_;
                  pIVar12 = pIVar11;
                  if ((pTVar5 != (Thread *)0x0) &&
                     (iVar2 = (pTVar5->field_0).ref, (pTVar5->field_0).ref = iVar2 + -1, iVar2 < 2))
                  {
                    pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
                    this->freelist_ = pTVar5;
                  }
                }
                break;
              }
              __dest = this->match_;
              if (((this->matched_ != true) || (pcVar7 = *pTVar5->capture, pcVar7 < *__dest)) ||
                 ((pcVar7 == *__dest && (__dest[1] < pcVar9)))) {
                memmove(__dest,pTVar5->capture,(long)this->ncapture_ << 3);
                this->match_[1] = pcVar9;
                goto LAB_011d24f2;
              }
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Unhandled ",10)
            ;
            poVar10 = (ostream *)std::ostream::operator<<(local_1a8,pIVar6[iVar2].out_opcode_ & 7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," in step",8);
            std::__cxx11::ostringstream::~ostringstream(local_1a8);
            std::ios_base::~ios_base(local_138);
          }
        }
        iVar2 = (pTVar5->field_0).ref;
        (pTVar5->field_0).ref = iVar2 + -1;
        if (iVar2 < 2) {
          pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
          this->freelist_ = pTVar5;
        }
      }
      pIVar12 = pIVar12 + 1;
      pIVar11 = (runq->dense_).ptr_._M_t.
                super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                .
                super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
                ._M_head_impl;
    } while (pIVar12 != pIVar11 + runq->size_);
  }
  runq->size_ = 0;
  return 0;
}

Assistant:

int NFA::Step(Threadq* runq, Threadq* nextq, int c, const StringPiece& context,
              const char* p) {
  nextq->clear();

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
    Thread* t = i->value();
    if (t == NULL)
      continue;

    if (longest_) {
      // Can skip any threads started after our current best match.
      if (matched_ && match_[0] < t->capture[0]) {
        Decref(t);
        continue;
      }
    }

    int id = i->index();
    Prog::Inst* ip = prog_->inst(id);

    switch (ip->opcode()) {
      default:
        // Should only see the values handled below.
        LOG(DFATAL) << "Unhandled " << ip->opcode() << " in step";
        break;

      case kInstByteRange:
        AddToThreadq(nextq, ip->out(), c, context, p, t);
        break;

      case kInstAltMatch:
        if (i != runq->begin())
          break;
        // The match is ours if we want it.
        if (ip->greedy(prog_) || longest_) {
          CopyCapture(match_, t->capture);
          matched_ = true;

          Decref(t);
          for (++i; i != runq->end(); ++i) {
            if (i->value() != NULL)
              Decref(i->value());
          }
          runq->clear();
          if (ip->greedy(prog_))
            return ip->out1();
          return ip->out();
        }
        break;

      case kInstMatch: {
        // Avoid invoking undefined behavior (arithmetic on a null pointer)
        // by storing p instead of p-1. (What would the latter even mean?!)
        // This complements the special case in NFA::Search().
        if (p == NULL) {
          CopyCapture(match_, t->capture);
          match_[1] = p;
          matched_ = true;
          break;
        }

        if (endmatch_ && p-1 != etext_)
          break;

        if (longest_) {
          // Leftmost-longest mode: save this match only if
          // it is either farther to the left or at the same
          // point but longer than an existing match.
          if (!matched_ || t->capture[0] < match_[0] ||
              (t->capture[0] == match_[0] && p-1 > match_[1])) {
            CopyCapture(match_, t->capture);
            match_[1] = p-1;
            matched_ = true;
          }
        } else {
          // Leftmost-biased mode: this match is by definition
          // better than what we've already found (see next line).
          CopyCapture(match_, t->capture);
          match_[1] = p-1;
          matched_ = true;

          // Cut off the threads that can only find matches
          // worse than the one we just found: don't run the
          // rest of the current Threadq.
          Decref(t);
          for (++i; i != runq->end(); ++i) {
            if (i->value() != NULL)
              Decref(i->value());
          }
          runq->clear();
          return 0;
        }
        break;
      }
    }
    Decref(t);
  }
  runq->clear();
  return 0;
}